

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Skeleton>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Skeleton *skel,
               string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *pTVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  long *plVar9;
  const_iterator cVar10;
  mapped_type *this;
  anon_struct_8_0_00000001_for___align aVar11;
  Property *pPVar12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  ParseResult ret;
  Attribute *attr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *in_stack_fffffffffffffc58;
  string local_3a0;
  undefined1 local_380 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *local_338;
  Property *local_330;
  string *local_328;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_320;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_318;
  _Base_ptr local_310;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  undefined1 local_2d8 [16];
  code *local_2c8;
  code *pcStack_2c0;
  ios_base local_268 [280];
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_150;
  storage_t<tinyusdz::Token> local_148;
  string *local_128;
  undefined1 local_120 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f8 [16];
  undefined1 local_e8 [32];
  long local_c8 [2];
  string local_b8 [16];
  undefined8 local_a8 [2];
  storage_t<tinyusdz::Token> local_98;
  _Any_data local_78;
  _Base_ptr local_68;
  _Base_ptr p_Stack_60;
  _Any_data local_58;
  pointer local_48;
  pointer pSStack_40;
  
  local_308._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_308._M_impl.super__Rb_tree_header._M_header;
  local_308._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar15 = false;
  local_308._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_308._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_338 = (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
               *)err;
  local_328 = warn;
  local_308._M_impl.super__Rb_tree_header._M_header._M_right =
       local_308._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_308,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)skel,err);
  if (bVar6) {
    aVar11 = (anon_struct_8_0_00000001_for___align)
             (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_120._0_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar15 = aVar11 == (anon_struct_8_0_00000001_for___align)local_120._0_8_;
    if (!bVar15) {
      local_148._8_8_ = &skel->animationSource;
      local_128 = (string *)&skel->bindTransforms;
      local_148._24_8_ = &skel->joints;
      local_148._16_8_ = &skel->jointNames;
      local_148.data._0_8_ = (undefined8)&skel->restTransforms;
      local_150 = &skel->extent;
      local_268._272_8_ = &skel->props;
      local_320 = &skel->purpose;
      local_318 = &skel->visibility;
      do {
        iVar7 = ::std::__cxx11::string::compare((char *)((long)aVar11 + 0x20));
        if (iVar7 == 0) {
          if (((*(uint *)((long)aVar11 + 0x2ec) & 0xfffffffe) == 2) &&
             (*(int *)((long)aVar11 + 0x2f0) == 1)) {
            nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                      ((optional<tinyusdz::Relationship> *)local_148._8_8_,
                       (Relationship *)((long)aVar11 + 0x2f0));
            local_2d8._0_8_ = &local_2c8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2d8,"skel:animationSource","");
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_308,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d8);
            if ((code **)local_2d8._0_8_ != &local_2c8) {
              operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
            }
            goto LAB_001f2d3f;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2d8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xb67);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"`",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2d8,"skel:animationSource",0x14);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2d8,"` must be a Relationship with Path target.",0x2a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"\n",1);
          pTVar4 = local_338;
          if (local_338 !=
              (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
               *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar9 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)&local_3a0,(ulong)(pTVar4->_metas).interpolation);
            psVar1 = (size_type *)(plVar9 + 2);
            if ((size_type *)*plVar9 == psVar1) {
              local_380._16_8_ = *psVar1;
              aStack_368._M_allocated_capacity = plVar9[3];
              local_380._0_8_ = local_380 + 0x10;
            }
            else {
              local_380._16_8_ = *psVar1;
              local_380._0_8_ = (size_type *)*plVar9;
            }
            local_380._8_8_ = plVar9[1];
            *plVar9 = (long)psVar1;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)pTVar4,(string *)local_380);
            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
LAB_001f31a5:
              operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
            }
LAB_001f31b2:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
LAB_001f31ce:
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
          ::std::ios_base::~ios_base(local_268);
          iVar7 = 1;
        }
        else {
LAB_001f2d3f:
          local_98.data._0_8_ = (undefined8)((long)&local_98 + 0x10);
          local_310 = (_Base_ptr)((long)aVar11 + 0x20);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,*(long *)((long)aVar11 + 0x20),
                     (long)&(*(_Base_ptr *)((long)aVar11 + 0x28))->_M_color +
                     *(long *)((long)aVar11 + 0x20));
          local_2d8._0_8_ = &local_2c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"bindTransforms","")
          ;
          pPVar12 = (Property *)local_2d8;
          local_330 = (Property *)((long)aVar11 + 0x40);
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                    ((ParseResult *)local_380,(_anonymous_namespace_ *)&local_308,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_98,(string *)((long)aVar11 + 0x40),(Property *)local_2d8,local_128,
                     in_stack_fffffffffffffc58);
          if ((code **)local_2d8._0_8_ != &local_2c8) {
            operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
          }
          if (local_98.data.__align !=
              (anon_struct_8_0_00000001_for___align)((long)&local_98 + 0x10)) {
            operator_delete((void *)local_98.data._0_8_,local_98._16_8_ + 1);
          }
          iVar7 = 0;
          if ((local_380._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_001f3274:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_380._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xb6d);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_358,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[15],std::__cxx11::string>
                        (&local_3a0,(fmt *)&local_358,(string *)"bindTransforms",
                         (char (*) [15])(local_380 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar12);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2d8,local_3a0._M_dataplus._M_p,
                                  local_3a0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p,
                                local_3a0.field_2._M_allocated_capacity + 1);
              }
              pTVar4 = local_338;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_dataplus._M_p != &local_358.field_2) {
                operator_delete(local_358._M_dataplus._M_p,
                                local_358.field_2._M_allocated_capacity + 1);
              }
              if (pTVar4 != (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                             *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar9 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)&local_358,(ulong)(pTVar4->_metas).interpolation
                                           );
                psVar1 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_3a0.field_2._M_allocated_capacity = *psVar1;
                  local_3a0.field_2._8_8_ = plVar9[3];
                  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
                }
                else {
                  local_3a0.field_2._M_allocated_capacity = *psVar1;
                  local_3a0._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_3a0._M_string_length = plVar9[1];
                *plVar9 = (long)psVar1;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                  operator_delete(local_3a0._M_dataplus._M_p,
                                  local_3a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_358._M_dataplus._M_p != &local_358.field_2) {
                  operator_delete(local_358._M_dataplus._M_p,
                                  local_358.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar7 = 1;
              goto LAB_001f3274;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._8_8_ != &aStack_368) {
            operator_delete((void *)local_380._8_8_,aStack_368._M_allocated_capacity + 1);
          }
          if (bVar6) {
            local_b8._0_8_ = local_a8;
            ::std::__cxx11::string::_M_construct<char*>
                      (local_b8,*(long *)((long)aVar11 + 0x20),
                       (long)&(*(_Base_ptr *)((long)aVar11 + 0x28))->_M_color +
                       *(long *)((long)aVar11 + 0x20));
            local_2d8._0_8_ = &local_2c8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"joints","");
            pPVar12 = (Property *)local_2d8;
            (anonymous_namespace)::
            ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      ((ParseResult *)local_380,(_anonymous_namespace_ *)&local_308,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_b8,(string *)local_330,(Property *)local_2d8,
                       (string *)local_148._24_8_,
                       (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                        *)in_stack_fffffffffffffc58);
            if ((code **)local_2d8._0_8_ != &local_2c8) {
              operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
            }
            if ((undefined8 *)local_b8._0_8_ != local_a8) {
              operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
            }
            iVar7 = 0;
            if ((local_380._0_8_ & 0xfffffffd) == 0) {
              iVar7 = 3;
LAB_001f357b:
              bVar6 = false;
            }
            else {
              bVar6 = true;
              if (local_380._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2d8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2d8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xb6e);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_358,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[7],std::__cxx11::string>
                          (&local_3a0,(fmt *)&local_358,(string *)"joints",
                           (char (*) [7])(local_380 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar12);
                poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_2d8,local_3a0._M_dataplus._M_p,
                                    local_3a0._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                  operator_delete(local_3a0._M_dataplus._M_p,
                                  local_3a0.field_2._M_allocated_capacity + 1);
                }
                pTVar4 = local_338;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_358._M_dataplus._M_p != &local_358.field_2) {
                  operator_delete(local_358._M_dataplus._M_p,
                                  local_358.field_2._M_allocated_capacity + 1);
                }
                if (pTVar4 != (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                               *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar9 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)&local_358,
                                              (ulong)(pTVar4->_metas).interpolation);
                  psVar1 = (size_type *)(plVar9 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar9 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_3a0.field_2._M_allocated_capacity = *psVar1;
                    local_3a0.field_2._8_8_ = plVar9[3];
                    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
                  }
                  else {
                    local_3a0.field_2._M_allocated_capacity = *psVar1;
                    local_3a0._M_dataplus._M_p = (pointer)*plVar9;
                  }
                  local_3a0._M_string_length = plVar9[1];
                  *plVar9 = (long)psVar1;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                    operator_delete(local_3a0._M_dataplus._M_p,
                                    local_3a0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_358._M_dataplus._M_p != &local_358.field_2) {
                    operator_delete(local_358._M_dataplus._M_p,
                                    local_358.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
                ::std::ios_base::~ios_base(local_268);
                iVar7 = 1;
                goto LAB_001f357b;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._8_8_ != &aStack_368) {
              operator_delete((void *)local_380._8_8_,aStack_368._M_allocated_capacity + 1);
            }
            if (bVar6) {
              local_e8._16_8_ = local_c8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_e8 + 0x10),*(long *)((long)aVar11 + 0x20),
                         (long)&(*(_Base_ptr *)((long)aVar11 + 0x28))->_M_color +
                         *(long *)((long)aVar11 + 0x20));
              local_2d8._0_8_ = &local_2c8;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"jointNames","")
              ;
              pPVar12 = (Property *)local_2d8;
              (anonymous_namespace)::
              ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                        ((ParseResult *)local_380,(_anonymous_namespace_ *)&local_308,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_e8 + 0x10),(string *)local_330,(Property *)local_2d8,
                         (string *)local_148._16_8_,
                         (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                          *)in_stack_fffffffffffffc58);
              if ((code **)local_2d8._0_8_ != &local_2c8) {
                operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
              }
              if ((long *)local_e8._16_8_ != local_c8) {
                operator_delete((void *)local_e8._16_8_,local_c8[0] + 1);
              }
              iVar7 = 0;
              if ((local_380._0_8_ & 0xfffffffd) == 0) {
                iVar7 = 3;
LAB_001f3882:
                bVar6 = false;
              }
              else {
                bVar6 = true;
                if (local_380._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2d8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2d8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2d8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3)
                  ;
                  poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xb6f);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_358,"Parsing attribute `{}` failed. Error: {}","");
                  fmt::format<char[11],std::__cxx11::string>
                            (&local_3a0,(fmt *)&local_358,(string *)"jointNames",
                             (char (*) [11])(local_380 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar12);
                  poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_2d8,local_3a0._M_dataplus._M_p,
                                      local_3a0._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                    operator_delete(local_3a0._M_dataplus._M_p,
                                    local_3a0.field_2._M_allocated_capacity + 1);
                  }
                  pTVar4 = local_338;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_358._M_dataplus._M_p != &local_358.field_2) {
                    operator_delete(local_358._M_dataplus._M_p,
                                    local_358.field_2._M_allocated_capacity + 1);
                  }
                  if (pTVar4 != (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                                 *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar9 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)&local_358,
                                                (ulong)(pTVar4->_metas).interpolation);
                    psVar1 = (size_type *)(plVar9 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_3a0.field_2._M_allocated_capacity = *psVar1;
                      local_3a0.field_2._8_8_ = plVar9[3];
                      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
                    }
                    else {
                      local_3a0.field_2._M_allocated_capacity = *psVar1;
                      local_3a0._M_dataplus._M_p = (pointer)*plVar9;
                    }
                    local_3a0._M_string_length = plVar9[1];
                    *plVar9 = (long)psVar1;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3a0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                      operator_delete(local_3a0._M_dataplus._M_p,
                                      local_3a0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_358._M_dataplus._M_p != &local_358.field_2) {
                      operator_delete(local_358._M_dataplus._M_p,
                                      local_358.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
                  ::std::ios_base::~ios_base(local_268);
                  iVar7 = 1;
                  goto LAB_001f3882;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._8_8_ != &aStack_368) {
                operator_delete((void *)local_380._8_8_,aStack_368._M_allocated_capacity + 1);
              }
              if (bVar6) {
                local_f8._0_8_ = local_e8;
                ::std::__cxx11::string::_M_construct<char*>
                          (local_f8,*(long *)((long)aVar11 + 0x20),
                           (long)&(*(_Base_ptr *)((long)aVar11 + 0x28))->_M_color +
                           *(long *)((long)aVar11 + 0x20));
                local_2d8._0_8_ = &local_2c8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2d8,"restTransforms","");
                pPVar12 = (Property *)local_2d8;
                (anonymous_namespace)::
                ParseTypedAttribute<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                          ((ParseResult *)local_380,(_anonymous_namespace_ *)&local_308,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_f8,(string *)local_330,(Property *)local_2d8,
                           (string *)local_148.data._0_8_,in_stack_fffffffffffffc58);
                if ((code **)local_2d8._0_8_ != &local_2c8) {
                  operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
                }
                if ((undefined1 *)local_f8._0_8_ != local_e8) {
                  operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
                }
                iVar7 = 0;
                if ((local_380._0_8_ & 0xfffffffd) == 0) {
                  iVar7 = 3;
LAB_001f3b89:
                  bVar6 = false;
                }
                else {
                  bVar6 = true;
                  if (local_380._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2d8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2d8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2d8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2d8,"():",3);
                    poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xb70);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_358,"Parsing attribute `{}` failed. Error: {}","");
                    fmt::format<char[15],std::__cxx11::string>
                              (&local_3a0,(fmt *)&local_358,(string *)"restTransforms",
                               (char (*) [15])(local_380 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar12);
                    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_2d8,local_3a0._M_dataplus._M_p,
                                        local_3a0._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                      operator_delete(local_3a0._M_dataplus._M_p,
                                      local_3a0.field_2._M_allocated_capacity + 1);
                    }
                    pTVar4 = local_338;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_358._M_dataplus._M_p != &local_358.field_2) {
                      operator_delete(local_358._M_dataplus._M_p,
                                      local_358.field_2._M_allocated_capacity + 1);
                    }
                    if (pTVar4 != (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                                   *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar9 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)&local_358,
                                                  (ulong)(pTVar4->_metas).interpolation);
                      psVar1 = (size_type *)(plVar9 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_3a0.field_2._M_allocated_capacity = *psVar1;
                        local_3a0.field_2._8_8_ = plVar9[3];
                        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
                      }
                      else {
                        local_3a0.field_2._M_allocated_capacity = *psVar1;
                        local_3a0._M_dataplus._M_p = (pointer)*plVar9;
                      }
                      local_3a0._M_string_length = plVar9[1];
                      *plVar9 = (long)psVar1;
                      plVar9[1] = 0;
                      *(undefined1 *)(plVar9 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3a0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                        operator_delete(local_3a0._M_dataplus._M_p,
                                        local_3a0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_358._M_dataplus._M_p != &local_358.field_2) {
                        operator_delete(local_358._M_dataplus._M_p,
                                        local_358.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
                    ::std::ios_base::~ios_base(local_268);
                    iVar7 = 1;
                    goto LAB_001f3b89;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._8_8_ != &aStack_368) {
                  operator_delete((void *)local_380._8_8_,aStack_368._M_allocated_capacity + 1);
                }
                p_Var5 = local_310;
                if (bVar6) {
                  iVar7 = ::std::__cxx11::string::compare((char *)local_310);
                  if (iVar7 == 0) {
                    local_2d8._0_8_ = &local_2c8;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2d8,"visibility","");
                    cVar10 = ::std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_308,(key_type *)local_2d8);
                    if ((code **)local_2d8._0_8_ != &local_2c8) {
                      operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
                    }
                    iVar7 = 3;
                    if ((_Rb_tree_header *)cVar10._M_node ==
                        &local_308._M_impl.super__Rb_tree_header) {
                      if ((*(uint *)((long)aVar11 + 0x2ec) & 0xfffffffe) == 2) {
                        local_2d8._0_8_ = &local_2c8;
                        local_2d8._8_8_ = 0;
                        local_2c8 = (code *)((ulong)local_2c8 & 0xffffffffffffff00);
                      }
                      else {
                        Attribute::type_name_abi_cxx11_((string *)local_2d8,&local_330->_attrib);
                      }
                      psVar1 = (size_type *)(local_380 + 0x10);
                      local_380._8_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x5;
                      local_380._16_6_ = 0x6e656b6f74;
                      local_380._0_8_ = psVar1;
                      if (((local_2d8._8_8_ == 5) &&
                          (iVar7 = bcmp((void *)local_2d8._0_8_,psVar1,5), iVar7 == 0)) &&
                         (uVar3 = *(uint *)((long)aVar11 + 0x2ec), uVar3 < 2)) {
                        if ((code **)local_2d8._0_8_ != &local_2c8) {
                          operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
                        }
                        if (uVar3 == 0) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"[warn]",6);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"():",3);
                          poVar8 = (ostream *)
                                   ::std::ostream::operator<<((Property *)local_2d8,0xb72);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"No value assigned to `",0x16);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"visibility",10);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,
                                     "` token attribute. Set default token value.",0x2b);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"\n",1);
                          if (local_328 != (string *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_380,&local_3a0,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_338);
                            ::std::__cxx11::string::operator=
                                      ((string *)local_328,(string *)local_380);
                            if ((size_type *)local_380._0_8_ != psVar1) {
                              operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                              operator_delete(local_3a0._M_dataplus._M_p,
                                              local_3a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
                          ::std::ios_base::~ios_base(local_268);
                          AttrMetas::operator=
                                    (&local_318->_metas,(AttrMetas *)((long)aVar11 + 0xe0));
                          pcVar14 = "visibility";
                          pcVar13 = "";
LAB_001f47a0:
                          iVar7 = 3;
                          local_2d8._0_8_ = &local_2c8;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2d8,pcVar14,pcVar13);
                          ::std::
                          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          ::_M_insert_unique<std::__cxx11::string>
                                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      *)&local_308,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_2d8);
                          if ((code **)local_2d8._0_8_ != &local_2c8) {
                            operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
                          }
                          goto LAB_001f499a;
                        }
                      }
                      else if ((code **)local_2d8._0_8_ != &local_2c8) {
                        operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
                      }
                      local_2d8._8_8_ = 0;
                      local_2d8._0_8_ = VisibilityEnumHandler;
                      pcStack_2c0 = ::std::
                                    _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    ::_M_invoke;
                      local_2c8 = ::std::
                                  _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                  ::_M_manager;
                      local_380._0_8_ = psVar1;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_380,"visibility","");
                      bVar6 = options->strict_allowedToken_check;
                      local_48 = (pointer)0x0;
                      pSStack_40 = (pointer)0x0;
                      local_58._M_unused._M_object = (_Base_ptr)0x0;
                      local_58._8_8_ = 0;
                      if (local_2c8 != (code *)0x0) {
                        (*local_2c8)(&local_58,(Property *)local_2d8,2);
                        local_48 = (pointer)local_2c8;
                        pSStack_40 = (pointer)pcStack_2c0;
                      }
                      in_stack_fffffffffffffc58 = local_338;
                      bVar6 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                        ((string *)local_380,bVar6,
                                         (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,
                                         &local_330->_attrib,local_318,local_328,(string *)local_338
                                        );
                      if (local_48 != (pointer)0x0) {
                        (*(code *)local_48)(&local_58,&local_58,3);
                      }
                      if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
                        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
                      }
                      iVar7 = 1;
                      if (bVar6) {
                        AttrMetas::operator=(&local_318->_metas,(AttrMetas *)((long)aVar11 + 0xe0));
                        pcVar14 = "visibility";
                        pcVar13 = "";
LAB_001f494f:
                        local_380._0_8_ = local_380 + 0x10;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_380,pcVar14,pcVar13);
                        ::std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string>
                                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)&local_308,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_380);
                        if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
                          operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
                        }
                        iVar7 = 3;
                      }
                      goto LAB_001f4980;
                    }
                  }
                  else {
                    iVar7 = ::std::__cxx11::string::compare((char *)p_Var5);
                    if (iVar7 == 0) {
                      local_2d8._0_8_ = &local_2c8;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2d8,"purpose","");
                      cVar10 = ::std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_308,(key_type *)local_2d8);
                      if ((code **)local_2d8._0_8_ != &local_2c8) {
                        operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
                      }
                      iVar7 = 3;
                      if ((_Rb_tree_header *)cVar10._M_node !=
                          &local_308._M_impl.super__Rb_tree_header) goto LAB_001f499a;
                      if ((*(uint *)((long)aVar11 + 0x2ec) & 0xfffffffe) == 2) {
                        local_2d8._0_8_ = &local_2c8;
                        local_2d8._8_8_ = 0;
                        local_2c8 = (code *)((ulong)local_2c8 & 0xffffffffffffff00);
                      }
                      else {
                        Attribute::type_name_abi_cxx11_((string *)local_2d8,&local_330->_attrib);
                      }
                      psVar1 = (size_type *)(local_380 + 0x10);
                      local_380._8_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x5;
                      local_380._16_6_ = 0x6e656b6f74;
                      local_380._0_8_ = psVar1;
                      if (((local_2d8._8_8_ == 5) &&
                          (iVar7 = bcmp((void *)local_2d8._0_8_,psVar1,5), iVar7 == 0)) &&
                         (uVar3 = *(uint *)((long)aVar11 + 0x2ec), uVar3 < 2)) {
                        if ((code **)local_2d8._0_8_ != &local_2c8) {
                          operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
                        }
                        if (uVar3 == 0) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"[warn]",6);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"():",3);
                          poVar8 = (ostream *)
                                   ::std::ostream::operator<<((Property *)local_2d8,0xb74);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"No value assigned to `",0x16);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"purpose",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,
                                     "` token attribute. Set default token value.",0x2b);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"\n",1);
                          if (local_328 != (string *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_380,&local_3a0,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_338);
                            ::std::__cxx11::string::operator=
                                      ((string *)local_328,(string *)local_380);
                            if ((size_type *)local_380._0_8_ != psVar1) {
                              operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                              operator_delete(local_3a0._M_dataplus._M_p,
                                              local_3a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
                          ::std::ios_base::~ios_base(local_268);
                          AttrMetas::operator=
                                    (&local_320->_metas,(AttrMetas *)((long)aVar11 + 0xe0));
                          pcVar14 = "purpose";
                          pcVar13 = "";
                          goto LAB_001f47a0;
                        }
                      }
                      else if ((code **)local_2d8._0_8_ != &local_2c8) {
                        operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
                      }
                      local_2d8._8_8_ = 0;
                      local_2d8._0_8_ = PurposeEnumHandler;
                      pcStack_2c0 = ::std::
                                    _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    ::_M_invoke;
                      local_2c8 = ::std::
                                  _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                  ::_M_manager;
                      local_380._0_8_ = psVar1;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_380,"purpose","");
                      bVar6 = options->strict_allowedToken_check;
                      local_68 = (_Base_ptr)0x0;
                      p_Stack_60 = (_Base_ptr)0x0;
                      local_78._M_unused._M_object = (void *)0x0;
                      local_78._8_8_ = 0;
                      if (local_2c8 != (code *)0x0) {
                        (*local_2c8)(&local_78,(Property *)local_2d8,2);
                        local_68 = (_Base_ptr)local_2c8;
                        p_Stack_60 = (_Base_ptr)pcStack_2c0;
                      }
                      in_stack_fffffffffffffc58 = local_338;
                      bVar6 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                        ((string *)local_380,bVar6,
                                         (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,
                                         &local_330->_attrib,local_320,local_328,(string *)local_338
                                        );
                      if (local_68 != (_Base_ptr)0x0) {
                        (*(code *)local_68)(&local_78,&local_78,3);
                      }
                      if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
                        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
                      }
                      iVar7 = 1;
                      if (bVar6) {
                        AttrMetas::operator=(&local_320->_metas,(AttrMetas *)((long)aVar11 + 0xe0));
                        pcVar14 = "purpose";
                        pcVar13 = "";
                        goto LAB_001f494f;
                      }
LAB_001f4980:
                      if (local_2c8 != (code *)0x0) {
                        (*local_2c8)((Property *)local_2d8,(Property *)local_2d8,3);
                      }
                    }
                    else {
                      local_120._8_8_ = &local_108;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)(local_120 + 8),*(long *)((long)aVar11 + 0x20),
                                 (long)&(*(_Base_ptr *)((long)aVar11 + 0x28))->_M_color +
                                 *(long *)((long)aVar11 + 0x20));
                      local_2d8._0_8_ = &local_2c8;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2d8,"extent","");
                      pPVar12 = local_330;
                      anon_unknown_0::ParseExtentAttribute
                                ((ParseResult *)local_380,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_308,(string *)(local_120 + 8),local_330,
                                 (string *)local_2d8,local_150);
                      if ((code **)local_2d8._0_8_ != &local_2c8) {
                        operator_delete((void *)local_2d8._0_8_,(ulong)((long)local_2c8 + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_120._8_8_ != &local_108) {
                        operator_delete((void *)local_120._8_8_,local_108._M_allocated_capacity + 1)
                        ;
                      }
                      iVar7 = 0;
                      if ((local_380._0_8_ & 0xfffffffd) == 0) {
                        iVar7 = 3;
LAB_001f3fcd:
                        bVar6 = false;
                      }
                      else {
                        bVar6 = true;
                        if (local_380._0_4_ != Unmatched) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"():",3);
                          poVar8 = (ostream *)
                                   ::std::ostream::operator<<((Property *)local_2d8,0xb75);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_358,
                                     "Parsing attribute `extent` failed. Error: {}","");
                          fmt::format<std::__cxx11::string>
                                    ((string *)&local_3a0,(fmt *)&local_358,
                                     (string *)(local_380 + 8),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pPVar12);
                          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_2d8,local_3a0._M_dataplus._M_p,
                                              local_3a0._M_string_length);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                            operator_delete(local_3a0._M_dataplus._M_p,
                                            local_3a0.field_2._M_allocated_capacity + 1);
                          }
                          pTVar4 = local_338;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_358._M_dataplus._M_p != &local_358.field_2) {
                            operator_delete(local_358._M_dataplus._M_p,
                                            local_358.field_2._M_allocated_capacity + 1);
                          }
                          if (pTVar4 != (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                                         *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+(&local_3a0,&local_358,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)pTVar4);
                            ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&local_3a0)
                            ;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                              operator_delete(local_3a0._M_dataplus._M_p,
                                              local_3a0.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
                              operator_delete(local_358._M_dataplus._M_p,
                                              local_358.field_2._M_allocated_capacity + 1);
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
                          ::std::ios_base::~ios_base(local_268);
                          iVar7 = 1;
                          goto LAB_001f3fcd;
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_380._8_8_ != &aStack_368) {
                        operator_delete((void *)local_380._8_8_,aStack_368._M_allocated_capacity + 1
                                       );
                      }
                      p_Var5 = local_310;
                      if (bVar6) {
                        cVar10 = ::std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&local_308,(key_type *)local_310);
                        p_Var2 = &local_308._M_impl.super__Rb_tree_header;
                        if ((_Rb_tree_header *)cVar10._M_node == p_Var2) {
                          this = ::std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                               *)local_268._272_8_,(key_type *)p_Var5);
                          Property::operator=(this,local_330);
                          ::std::
                          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          ::_M_insert_unique<std::__cxx11::string_const&>
                                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      *)&local_308,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)p_Var5);
                        }
                        cVar10 = ::std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&local_308,(key_type *)p_Var5);
                        iVar7 = 0;
                        if ((_Rb_tree_header *)cVar10._M_node == p_Var2) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2d8,"():",3);
                          poVar8 = (ostream *)
                                   ::std::ostream::operator<<((Property *)local_2d8,0xb77);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_380,"Unsupported/unimplemented property: ",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_310);
                          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_2d8,(char *)local_380._0_8_,
                                              local_380._8_8_);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                          if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
                            operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
                          }
                          pTVar4 = local_338;
                          if (local_338 !=
                              (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                               *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_380,&local_3a0,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)pTVar4);
                            ::std::__cxx11::string::operator=((string *)pTVar4,(string *)local_380);
                            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10)
                            goto LAB_001f31a5;
                            goto LAB_001f31b2;
                          }
                          goto LAB_001f31ce;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_001f499a:
        if ((iVar7 != 3) && (iVar7 != 0)) break;
        aVar11 = (anon_struct_8_0_00000001_for___align)
                 ::std::_Rb_tree_increment((_Rb_tree_node_base *)aVar11);
        bVar15 = aVar11 == (anon_struct_8_0_00000001_for___align)local_120._0_8_;
      } while (!bVar15);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_308,(_Link_type)local_308._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar15;
}

Assistant:

bool ReconstructPrim<Skeleton>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Skeleton *skel,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &skel->xformOps, err)) {
    return false;
  }

  for (auto &prop : properties) {

    // SkelBindingAPI
    if (prop.first == kSkelAnimationSource) {

      // Must be relation of type Path.
      if (prop.second.is_relationship() && prop.second.get_relationship().is_path()) {
        {
          const Relationship &rel = prop.second.get_relationship();
          if (rel.is_path()) {
            skel->animationSource = rel;
            table.insert(kSkelAnimationSource);
          } else {
            PUSH_ERROR_AND_RETURN("`" << kSkelAnimationSource << "` target must be Path.");
          }
        }
      } else {
        PUSH_ERROR_AND_RETURN(
            "`" << kSkelAnimationSource << "` must be a Relationship with Path target.");
      }
    }

    //

    PARSE_TYPED_ATTRIBUTE(table, prop, "bindTransforms", Skeleton, skel->bindTransforms)
    PARSE_TYPED_ATTRIBUTE(table, prop, "joints", Skeleton, skel->joints)
    PARSE_TYPED_ATTRIBUTE(table, prop, "jointNames", Skeleton, skel->jointNames)
    PARSE_TYPED_ATTRIBUTE(table, prop, "restTransforms", Skeleton, skel->restTransforms)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, Skeleton,
                   skel->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "purpose", Purpose, PurposeEnumHandler, Skeleton,
                       skel->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, "extent", Skeleton, skel->extent)
    ADD_PROPERTY(table, prop, Skeleton, skel->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

#if 0 // TODO: bindTransforms & restTransforms check somewhere.
  // usdview and Houdini USD importer expects both `bindTransforms` and `restTransforms` are authored in USD
  if (!table.count("bindTransforms")) {
    // usdview and Houdini allow `bindTransforms` is not authord in USD, but it cannot compute skinning correctly without it,
    // so report an error in TinyUSDZ for a while.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`bindTransforms` is missing in Skeleton. Currently TinyUSDZ expects `bindTransforms` must exist in Skeleton.");
  }

  if (!table.count("restTransforms")) {
    // usdview and Houdini allow `restTransforms` is not authord in USD(usdview warns it), but it cannot compute skinning correctly without it,
    // (even SkelAnimation supplies trasnforms for all joints)
    // so report an error in TinyUSDZ for a while.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`restTransforms`(local joint matrices at rest state) is missing in Skeleton. Currently TinyUSDZ expects `restTransforms` must exist in Skeleton.");
  }

  // len(bindTransforms) must be equal to len(restTransforms)
  // TODO: Support connection
  {
    bool valid = false;
    if (auto bt = skel->bindTransforms.get_value()) {
      if (auto rt = skel->restTransforms.get_value()) {
        if (bt.value().size() == rt.value().size()) {
          // ok
          valid = true;
        }
      }
    }

    if (!valid) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Array length must be same for `bindTransforms` and `restTransforms`.");
    }
  }
#endif

  return true;
}